

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_LD(void)

{
  bool bVar1;
  byte bVar2;
  word wVar3;
  Z80Reg ZVar4;
  EBracketType EVar5;
  Z80Reg ZVar6;
  Z80Reg ZVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  Z80Reg reg1;
  Z80Reg reg2;
  int pemaRes;
  int e [11];
  uint local_c;
  EBracketType bt;
  aint b;
  
  do {
    memset(&reg2,0xff,0x2c);
    ZVar4 = GetRegister(&::lp);
    if ((ZVar4 == Z80_UNK) || (bVar1 = LD_simple_r_r(&reg2,ZVar4), !bVar1)) {
      if (ZVar4 == Z80_UNK) {
        EVar5 = OpenBracket(&::lp);
        if (EVar5 != BT_NONE) {
          ZVar4 = GetRegister(&::lp);
          if (ZVar4 == Z80_UNK) {
            wVar3 = GetWord(&::lp);
            local_c = (uint)wVar3;
          }
          iVar8 = CloseBracket(&::lp);
          if ((iVar8 != 0) && (bVar1 = comma(&::lp), bVar1)) {
            ZVar6 = GetRegister(&::lp);
            switch(ZVar4) {
            default:
              break;
            case Z80_C:
              if (((Options::IsLR35902 & 1) != 0) && (ZVar6 == Z80_A)) {
                reg2 = 0xe2;
              }
              break;
            case Z80_BC:
            case Z80_DE:
              if (ZVar6 == Z80_A) {
                reg2 = ZVar4 + ~(Z80_I|Z80_L);
              }
              break;
            case Z80_UNK:
              if ((Options::IsLR35902 & 1) == 0) {
                uVar9 = (int)local_c >> 8;
                if (ZVar6 == Z80_A) {
LAB_00162ec2:
                  reg2 = LR35902_MEM_HL_I;
                  if (ZVar6 == Z80_A) {
                    reg2 = LR35902_MEM_HL_D;
                  }
                  pemaRes = local_c & 0xff;
                  e[0] = uVar9 & 0xff;
                  resolveRelocationAndSmartSmc(1,REGULAR);
                }
                else {
                  if ((ZVar6 != Z80_BC) && (ZVar6 != Z80_DE)) {
                    if (ZVar6 == Z80_HL) goto LAB_00162ec2;
                    if (ZVar6 != Z80_SP) {
                      if ((ZVar6 == Z80_IX) || (ZVar6 == Z80_IY)) {
                        pemaRes = 0x22;
                        e[0] = local_c & 0xff;
                        e[1] = uVar9 & 0xff;
                        reg2 = ZVar6;
                        resolveRelocationAndSmartSmc(2,REGULAR);
                      }
                      break;
                    }
                  }
                  if ((Options::IsI8080 & 1) == 0) {
                    reg2 = 0xed;
                    pemaRes = ZVar6 + (LR35902_MEM_HL_D|Z80_C);
                    e[0] = local_c & 0xff;
                    e[1] = uVar9 & 0xff;
                    resolveRelocationAndSmartSmc(2,REGULAR);
                  }
                }
              }
              else {
                LD_LR35902(&reg2,ZVar6,local_c);
              }
            }
          }
        }
      }
      else if ((uint)ZVar4 < 6) {
        reg2 = ZVar4 * 8 + Z80_MEM_HL;
        bVar2 = GetByteNoMem(&::lp,false);
        pemaRes = (int)bVar2;
        resolveRelocationAndSmartSmc(1,HIGH);
      }
      else if (ZVar4 == Z80_MEM_HL) {
        ZVar4 = GetRegister(&::lp);
        if (ZVar4 == Z80_UNK) {
          reg2 = Z80_HL|Z80_MEM_HL;
          bVar2 = GetByteNoMem(&::lp,false);
          pemaRes = (int)bVar2;
          resolveRelocationAndSmartSmc(1,HIGH);
        }
        else if (((ZVar4 == Z80_BC) || (ZVar4 == Z80_DE)) &&
                (bVar1 = Options::noFakes(true), !bVar1)) {
          ZVar6 = GetRegister_r16Low(ZVar4);
          reg2 = ZVar6 + (Z80_SP|Z80_HL);
          pemaRes = -2;
          e[0] = 0x23;
          e[1] = -2;
          ZVar4 = GetRegister_r16High(ZVar4);
          e[2] = ZVar4 + (Z80_SP|Z80_HL);
          e[3] = -2;
          e[4] = 0x2b;
        }
      }
      else if (ZVar4 == Z80_A) {
        EVar5 = OpenBracket(&::lp);
        if (EVar5 != BT_NONE) {
          ZVar4 = GetRegister(&::lp);
          if (((ZVar4 == Z80_BC) || (ZVar4 == Z80_DE)) && (iVar8 = CloseBracket(&::lp), iVar8 != 0))
          {
            reg2 = ZVar4 + ~Z80_L;
          }
          else if (((ZVar4 == Z80_C) && ((Options::IsLR35902 & 1) != 0)) &&
                  (iVar8 = CloseBracket(&::lp), iVar8 != 0)) {
            reg2 = 0xf2;
          }
          if (ZVar4 != Z80_UNK) goto LAB_00162f8f;
          ::lp = ::lp + -1;
        }
        iVar8 = ParseExpressionMemAccess(&::lp,(aint *)&local_c);
        if (iVar8 == 1) {
          check8(local_c);
          reg2 = Z80_HL|Z80_I|Z80_MEM_HL;
          pemaRes = local_c & 0xff;
          resolveRelocationAndSmartSmc(1,HIGH);
        }
        else if (iVar8 == 2) {
          check16(local_c);
          if ((Options::IsLR35902 & 1) == 0) {
            reg2 = Z80_HL|Z80_F;
            pemaRes = local_c & 0xff;
            e[0] = (int)local_c >> 8 & 0xff;
            resolveRelocationAndSmartSmc(1,REGULAR);
            if (EVar5 == BT_ROUND) {
              checkLowMemory((byte)e[0],(byte)pemaRes);
            }
          }
          else if (((int)local_c < 0xff00) || (0xffff < (int)local_c)) {
            reg2 = 0xfa;
            pemaRes = local_c & 0xff;
            e[0] = (int)local_c >> 8 & 0xff;
            resolveRelocationAndSmartSmc(1,REGULAR);
          }
          else {
            reg2 = 0xf0;
            pemaRes = local_c & 0xff;
          }
        }
      }
      else if ((((ZVar4 == Z80_BC) || (ZVar4 == Z80_DE)) || (ZVar4 == Z80_HL)) || (ZVar4 == Z80_SP))
      {
        ZVar6 = GetRegister(&::lp);
        if (ZVar6 == Z80_MEM_HL) {
          bVar1 = Options::noFakes(true);
          if (!bVar1) {
            reg2 = ZVar4 + (Z80_HL|Z80_I|Z80_MEM_HL);
            pemaRes = -2;
            e[0] = 0x23;
            e[1] = -2;
            e[2] = ZVar4 + (Z80_HL|Z80_MEM_HL);
            e[3] = -2;
            e[4] = 0x2b;
          }
        }
        else if (ZVar6 == Z80_SP) {
          if (((Options::IsLR35902 & 1) != 0) && (ZVar4 == Z80_HL)) {
            local_c = 0;
            iVar8 = SkipBlanks(&::lp);
            if ((iVar8 == 0) && (*::lp != ',')) {
              if ((*::lp != '+') && (*::lp != '-')) {
                Error("[LD] `ld hl,sp+r8` expects + or - after sp, found",::lp,PASS3);
                goto LAB_00162b83;
              }
              bVar2 = GetByteNoMem(&::lp,true);
              local_c = (uint)bVar2;
            }
            reg2 = 0xf8;
            pemaRes = local_c;
          }
        }
        else if ((((ZVar6 == Z80_MEM_IX) || (ZVar6 == Z80_MEM_IY)) && (ZVar4 != Z80_SP)) &&
                (bVar1 = Options::noFakes(true), !bVar1)) {
          pemaRes = ZVar4 + (Z80_HL|Z80_I|Z80_MEM_HL);
          e[3] = ZVar4 + (Z80_HL|Z80_MEM_HL);
          e[0] = GetRegister_lastIxyD;
          e[4] = GetRegister_lastIxyD + 1;
          if (GetRegister_lastIxyD == 0x7f) {
            Error("Offset out of range",(char *)0x0,IF_FIRST);
          }
          else {
            reg2 = ZVar6 & 0xff;
            e[2] = reg2;
          }
          e[1] = -2;
        }
LAB_00162b83:
        if (ZVar6 == Z80_UNK) {
          iVar8 = ParseExpressionMemAccess(&::lp,(aint *)&local_c);
          if (iVar8 == 1) {
            check16(local_c);
            reg2 = ZVar4 + ~(Z80_I|Z80_MEM_HL);
            pemaRes = local_c & 0xff;
            e[0] = (int)local_c >> 8 & 0xff;
            resolveRelocationAndSmartSmc(1,REGULAR);
          }
          else if ((iVar8 == 2) && ((Options::IsLR35902 & 1) == 0)) {
            check16(local_c);
            if (ZVar4 == Z80_HL) {
              reg2 = Z80_DE|Z80_F;
              pemaRes = local_c & 0xff;
              e[0] = (int)local_c >> 8 & 0xff;
              resolveRelocationAndSmartSmc(1,REGULAR);
            }
            else {
              if ((Options::IsI8080 & 1) != 0) goto LAB_00162f8f;
              reg2 = 0xed;
              pemaRes = ZVar4 + (Z80_HL|Z80_F|Z80_C);
              e[0] = local_c & 0xff;
              e[1] = (int)local_c >> 8 & 0xff;
              resolveRelocationAndSmartSmc(2,REGULAR);
            }
            if (::lp[-1] == ')') {
              checkLowMemory((byte)(local_c >> 8),(byte)local_c);
            }
          }
        }
      }
      else if ((ZVar4 == Z80_IX) || (ZVar4 == Z80_IY)) {
        iVar8 = ParseExpressionMemAccess(&::lp,(aint *)&local_c);
        if (0 < iVar8) {
          pemaRes = 0x2a;
          if (iVar8 == 1) {
            pemaRes = 0x21;
          }
          reg2 = ZVar4;
          check16(local_c);
          e[0] = local_c & 0xff;
          e[1] = (int)local_c >> 8 & 0xff;
          resolveRelocationAndSmartSmc(2,REGULAR);
          if ((iVar8 == 2) && (::lp[-1] == ')')) {
            checkLowMemory((byte)e[1],(byte)e[0]);
          }
        }
      }
      else if ((((ZVar4 == Z80_IXH) || (ZVar4 == Z80_IYH)) || (ZVar4 == Z80_IXL)) ||
              (ZVar4 == Z80_IYL)) {
        reg2 = ZVar4 & 0xff;
        pemaRes = (ZVar4 >> 8) * 8 + 6;
        bVar2 = GetByteNoMem(&::lp,false);
        e[0] = (int)bVar2;
        resolveRelocationAndSmartSmc(2,HIGH);
      }
      else if ((ZVar4 == Z80_MEM_IX) || (ZVar4 == Z80_MEM_IY)) {
        e[0] = GetRegister_lastIxyD;
        ZVar6 = GetRegister(&::lp);
        if (ZVar6 == Z80_UNK) {
          reg2 = ZVar4 & 0xff;
          pemaRes = 0x36;
          bVar2 = GetByteNoMem(&::lp,false);
          e[1] = (int)bVar2;
          resolveRelocationAndSmartSmc(3,HIGH);
        }
        else if ((((ZVar6 == Z80_BC) || (ZVar6 == Z80_DE)) || (ZVar6 == Z80_HL)) &&
                (bVar1 = Options::noFakes(true), !bVar1)) {
          if (e[0] == 0x7f) {
            Error("Offset out of range",(char *)0x0,IF_FIRST);
          }
          else {
            reg2 = ZVar4 & 0xff;
          }
          ZVar7 = GetRegister_r16Low(ZVar6);
          pemaRes = ZVar7 + (Z80_SP|Z80_HL);
          e[1] = -2;
          e[2] = ZVar4 & 0xff;
          ZVar4 = GetRegister_r16High(ZVar6);
          e[3] = ZVar4 + (Z80_SP|Z80_HL);
          e[4] = e[0] + 1;
        }
      }
LAB_00162f8f:
      EmitBytes(&reg2,true);
    }
    else {
      EmitBytes(&reg2,true);
    }
    uVar10 = (*DAT_001e16b0)(&::lp);
    if ((uVar10 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_LD() {
		aint b;
		EBracketType bt;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1 }, pemaRes;
			Z80Reg reg2 = Z80_UNK, reg1 = GetRegister(lp);
			// resolve all register to register cases or fixed memory literals
			// "(hl)|(ixy+d)|(hl+)|(hl-)" (but not other memory or constant)
			if (Z80_UNK != reg1 && LD_simple_r_r(e, reg1)) {
				EmitBytes(e, true);
				continue;
			}
			// memory, constant, fake instruction or syntax error is involved
			// (!!! comma is already parsed for all destination=register cases)
			switch (reg1) {
			case Z80_A:
				if (BT_NONE != (bt = OpenBracket(lp))) {
					reg2 = GetRegister(lp);
					if ((Z80_BC == reg2 || Z80_DE == reg2) && CloseBracket(lp)) e[0] = reg2-6;
					else if (Z80_C == reg2 && Options::IsLR35902 && CloseBracket(lp)) {
						e[0] = 0xF2;	// Sharp LR35902 `ld a,(c)` (targetting [$ff00+c])
					}
					if (Z80_UNK != reg2) break;	//"(register": emit instruction || bug
					// give non-register another chance to parse as value expression
					--lp;
				}
				switch (ParseExpressionMemAccess(lp, b)) {
					// LD a,imm8
					case 1:
						check8(b); e[0] = 0x06 + 8*reg1; e[1] = b & 255;
						resolveRelocationAndSmartSmc(1, Relocation::HIGH);
						break;
					// LD a,(mem8)
					case 2:
						check16(b);
						if (Options::IsLR35902) {
							if (0xFF00 <= b && b <= 0xFFFF) {
								e[0] = 0xF0; e[1] = b & 255;
							} else {
								e[0] = 0xFA; e[1] = b & 255; e[2] = (b >> 8) & 255;
								resolveRelocationAndSmartSmc(1);
							}
							break;
						}
						e[0] = 0x3a; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						if (BT_ROUND == bt) checkLowMemory(e[2], e[1]);
						break;
				}
				break;

			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				e[0] = 0x06 + 8*reg1; e[1] = GetByteNoMem(lp);
				resolveRelocationAndSmartSmc(1, Relocation::HIGH);
				break;

			case Z80_MEM_HL:
				switch (reg2 = GetRegister(lp)) {
				case Z80_BC: case Z80_DE:	// fake ld (hl),bc|de
					if (Options::noFakes()) break;
					e[0] = 0x70 + GetRegister_r16Low(reg2);		e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;								e[3] = INSTRUCTION_START_MARKER;
					e[4] = 0x70 + GetRegister_r16High(reg2);	e[5] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				case Z80_UNK:	// ld (hl),n
					e[0] = 0x36; e[1] = GetByteNoMem(lp);
					resolveRelocationAndSmartSmc(1, Relocation::HIGH);
					break;
				default:
					break;
				}
				break;

			case Z80_MEM_IX: case Z80_MEM_IY:
				e[2] = GetRegister_lastIxyD;
				switch (reg2 = GetRegister(lp)) {
				case Z80_BC: case Z80_DE: case Z80_HL:
					if (Options::noFakes()) break;		//fake LD (ixy+#),r16
					if (e[2] == 127) Error("Offset out of range", nullptr, IF_FIRST);
					else e[0] = reg1&0xFF;
					e[1] = 0x70+GetRegister_r16Low(reg2);
					e[3] = INSTRUCTION_START_MARKER;
					e[4] = reg1&0xFF;
					e[5] = 0x70+GetRegister_r16High(reg2);
					e[6] = e[2] + 1;
					break;
				case Z80_UNK:
					e[0] = reg1&0xFF; e[1] = 0x36; e[3] = GetByteNoMem(lp);	// LD (ixy+#),imm8
					resolveRelocationAndSmartSmc(3, Relocation::HIGH);
					break;
				default:
					break;
				}
				break;

			case Z80_IXH: case Z80_IXL: case Z80_IYH: case Z80_IYL:
				e[0] = reg1&0xFF; e[1] = 0x06 + 8*(reg1>>8); e[2] = GetByteNoMem(lp);
				resolveRelocationAndSmartSmc(2, Relocation::HIGH);
				break;

			case Z80_BC: case Z80_DE: case Z80_HL: case Z80_SP:
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:	// invalid combinations filtered already by LD_simple_r_r
					if (Options::noFakes()) break;	// fake ld bc|de,(hl)
					e[0] = reg1+0x3e;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;
					e[3] = INSTRUCTION_START_MARKER;
					e[4] = reg1+0x36;
					e[5] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:	// invalid combinations NOT filtered -> validate
					if (Z80_SP == reg1 || Options::noFakes()) break;	// fake bc|de|hl,(ix+#)
					e[1] = reg1+0x3e;
					e[5] = reg1+0x36;
					e[2] = GetRegister_lastIxyD;
					e[6] = e[2]+1;
					if (e[2] == 127) Error("Offset out of range", nullptr, IF_FIRST);
					else e[0] = e[4] = reg2&0xFF;
					e[3] = INSTRUCTION_START_MARKER;
					break;
				case Z80_SP:
					if (Options::IsLR35902 && Z80_HL == reg1) {		// "ld hl,sp+r8" syntax = "F8 r8"
						b = 0;
						// "sp" must be followed by + or - (or nothing: "ld hl,sp" = +0)
						if (!SkipBlanks(lp) && ',' != *lp ) {		// comma is probably multi-arg
							if ('+' != *lp && '-' != *lp) {
								Error("[LD] `ld hl,sp+r8` expects + or - after sp, found", lp);
								break;
							}
							b = GetByteNoMem(lp, true);
						}
						e[0] = 0xF8;
						e[1] = b;
					}
					break;
				default:
					break;
				}
				if (Z80_UNK != reg2) break;	//"(register": emit instruction || bug
				switch (ParseExpressionMemAccess(lp, b)) {
					// ld bc|de|hl|sp,imm16
					case 1: check16(b); e[0] = reg1-0x0F; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						break;
					// LD r16,(mem16)
					case 2:
						if (Options::IsLR35902) break;	// no "ld r16,(a16)" instruction on LR35902
						check16(b);
						if (Z80_HL == reg1) {		// ld hl,(mem16)
							e[0] = 0x2a; e[1] = b & 255; e[2] = (b >> 8) & 255;
							resolveRelocationAndSmartSmc(1);
						} else {					// ld bc|de|sp,(mem16)
							if (Options::IsI8080) break;
							e[0] = 0xed; e[1] = reg1+0x3b; e[2] = b & 255; e[3] = (b >> 8) & 255;
							resolveRelocationAndSmartSmc(2);
						}
						if (')' == lp[-1]) checkLowMemory(b>>8, b);
				}
				break;

			case Z80_IX:
			case Z80_IY:
				if (0 < (pemaRes = ParseExpressionMemAccess(lp, b))) {
					e[0] = reg1; e[1] = (1 == pemaRes) ? 0x21 : 0x2a;	// ld ix|iy,imm16  ||  ld ix|iy,(mem16)
					check16(b); e[2] = b & 255; e[3] = (b >> 8) & 255;
					resolveRelocationAndSmartSmc(2);
					if ((2 == pemaRes) && ')' == lp[-1]) checkLowMemory(e[3], e[2]);
				}
				break;

			case Z80_UNK:
				if (BT_NONE == OpenBracket(lp)) break;
				reg1 = GetRegister(lp);
				if (Z80_UNK == reg1) b = GetWord(lp);
				if (!CloseBracket(lp) || !comma(lp)) break;
				reg2 = GetRegister(lp);
				switch (reg1) {
				case Z80_C:
					if (Options::IsLR35902 && Z80_A == reg2) {	// Sharp LR35902 `ld (c),a` (targetting [$ff00+c])
						e[0] = 0xE2;
					}
					break;
				case Z80_BC:
				case Z80_DE:
					if (Z80_A == reg2) e[0] = reg1-14;	// LD (bc|de),a
					break;
				case Z80_UNK:
					if (Options::IsLR35902) {	// Sharp LR35902 has quite different opcodes for these
						LD_LR35902(e, reg2, b);
						break;
					}
					// Standard Z80 and i8080 opcodes for ld (nn),reg
					switch (reg2) {
					case Z80_A:		// LD (nnnn),a|hl
					case Z80_HL:
						e[0] = (Z80_A == reg2) ? 0x32 : 0x22; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						break;
					case Z80_BC:	// LD (nnnn),bc|de|sp
					case Z80_DE:
					case Z80_SP:
						if (Options::IsI8080) break;
						e[0] = 0xed; e[1] = 0x33+reg2; e[2] = b & 255; e[3] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(2);
						break;
					case Z80_IX:	// LD (nnnn),ix|iy
					case Z80_IY:
						e[0] = reg2; e[1] = 0x22; e[2] = b & 255; e[3] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(2);
						break;
					default:
						break;
					}
					break;
				default:
					break;
				}
				break;
			default:
				break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}